

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

int copy_value(adiak_value_t *target,adiak_datatype_t *datatype,void *ptr)

{
  int iVar1;
  void *pvVar2;
  char *local_68;
  uchar *array_base;
  char *sptr;
  timeval *v;
  adiak_value_t *newvalues;
  int i;
  int type_index;
  int result;
  int bytes_read;
  void *ptr_local;
  adiak_datatype_t *datatype_local;
  adiak_value_t *target_local;
  
  type_index = 0;
  newvalues._4_4_ = 0;
  switch(datatype->dtype) {
  case adiak_type_unset:
    target_local._4_4_ = -1;
    break;
  case adiak_long:
  case adiak_ulong:
  case adiak_date:
    *target = *ptr;
    target_local._4_4_ = 8;
    break;
  case adiak_int:
  case adiak_uint:
    target->v_int = *ptr;
    target_local._4_4_ = 4;
    break;
  case adiak_double:
    *target = *ptr;
    target_local._4_4_ = 8;
    break;
  case adiak_timeval:
    sptr = (char *)ptr;
    if (datatype->is_reference == 0) {
      sptr = (char *)malloc(0x10);
      *(undefined8 *)sptr = *ptr;
      *(undefined8 *)(sptr + 8) = *(undefined8 *)((long)ptr + 8);
    }
    target->v_ptr = sptr;
    target_local._4_4_ = 8;
    break;
  case adiak_version:
  case adiak_string:
  case adiak_catstring:
  case adiak_path:
    local_68 = *ptr;
    if (datatype->is_reference == 0) {
      local_68 = strdup(local_68);
    }
    target->v_ptr = local_68;
    target_local._4_4_ = 8;
    break;
  case adiak_range:
  case adiak_set:
  case adiak_list:
  case adiak_tuple:
    if (datatype->is_reference == 0) {
      pvVar2 = malloc((long)datatype->num_elements << 3);
      for (newvalues._0_4_ = 0; (int)newvalues < datatype->num_elements;
          newvalues._0_4_ = (int)newvalues + 1) {
        iVar1 = copy_value((adiak_value_t *)((long)pvVar2 + (long)(int)newvalues * 8),
                           datatype->subtype[newvalues._4_4_],(void *)((long)ptr + (long)type_index)
                          );
        if (iVar1 == -1) {
          return -1;
        }
        type_index = iVar1 + type_index;
        if (datatype->dtype == adiak_tuple) {
          newvalues._4_4_ = newvalues._4_4_ + 1;
        }
      }
      target->v_ptr = pvVar2;
      target_local._4_4_ = type_index;
    }
    else {
      target->v_ptr = ptr;
      target_local._4_4_ = calc_size(datatype);
    }
    break;
  case adiak_longlong:
  case adiak_ulonglong:
    *target = *ptr;
    target_local._4_4_ = 8;
    break;
  default:
    target_local._4_4_ = -1;
  }
  return target_local._4_4_;
}

Assistant:

static int copy_value(adiak_value_t *target, adiak_datatype_t *datatype, void *ptr) {
   int bytes_read = 0, result, type_index = 0, i;
   adiak_value_t *newvalues;
   switch (datatype->dtype) {
      case adiak_type_unset:
         return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
         target->v_long = *((long *) ptr);
         return sizeof(long);
      case adiak_longlong:
      case adiak_ulonglong:
         target->v_longlong = *((long long *) ptr);
         return sizeof(long long);
      case adiak_int:
      case adiak_uint:
         target->v_int = *((int *) ptr);
         return sizeof(int);
      case adiak_double:
         target->v_double= *((double *) ptr);
         return sizeof(double);
      case adiak_timeval: {
         struct timeval* v = (struct timeval*) ptr;
         if (!datatype->is_reference) {
             v = (struct timeval *) malloc(sizeof(struct timeval));
            *v = *(struct timeval *) ptr;
         }
         target->v_ptr = v;
         return sizeof(struct timeval *);
      }
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
         {
            char* sptr = (char*) *((void**) ptr);
            target->v_ptr = (datatype->is_reference ? sptr : strdup(sptr));
         }
         return sizeof(char *);
      case adiak_range:
      case adiak_set:
      case adiak_list:
      case adiak_tuple:
         if (datatype->is_reference) {
            target->v_ptr = ptr;
            return calc_size(datatype);
         }
         newvalues = (adiak_value_t *) malloc(sizeof(adiak_value_t) * datatype->num_elements);
         for (i = 0; i < datatype->num_elements; i++) {
            unsigned char *array_base = (unsigned char *) ptr;
            result = copy_value(newvalues+i, datatype->subtype[type_index], array_base + bytes_read);
            if (result == -1)
               return -1;
            bytes_read += result;
            if (datatype->dtype == adiak_tuple)
               type_index++;
         }
         target->v_subval = newvalues;
         return bytes_read;
   }
   return -1;
}